

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  pointer pAVar1;
  ulong uVar2;
  ostream *poVar3;
  Storage extraout_EDX;
  Storage storage;
  Storage extraout_EDX_00;
  InputType type;
  OutputType type_00;
  Usage usage;
  Storage extraout_EDX_01;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  stringstream name;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar6 = 0;
  uVar5 = 0;
  storage = extraout_EDX;
  while( true ) {
    pAVar1 = (this->arrays).
             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->arrays).
                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 6;
    if (uVar2 <= uVar5) break;
    if (1 < uVar2) {
      poVar3 = std::operator<<(local_1a8,"array");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"_");
      storage = extraout_EDX_00;
    }
    Array::storageToString_abi_cxx11_
              (&local_1f8,(Array *)(ulong)*(uint *)((long)&pAVar1->storage + lVar6),storage);
    poVar3 = std::operator<<(local_1a8,(string *)&local_1f8);
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)&pAVar1->offset + lVar6));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)&pAVar1->stride + lVar6));
    poVar3 = std::operator<<(poVar3,"_");
    Array::inputTypeToString_abi_cxx11_
              (&local_1d8,(Array *)(ulong)*(uint *)((long)&pAVar1->inputType + lVar6),type);
    std::operator<<(poVar3,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    if ((*(uint *)((long)&pAVar1->inputType + lVar6) & 0xfffffffe) != 10) {
      std::ostream::operator<<(local_1a8,*(int *)((long)&pAVar1->componentCount + lVar6));
    }
    poVar3 = std::operator<<(local_1a8,"_");
    pcVar4 = "";
    if ((&pAVar1->normalize)[lVar6] != false) {
      pcVar4 = "normalized_";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    Array::outputTypeToString_abi_cxx11_
              (&local_1f8,(Array *)(ulong)*(uint *)((long)&pAVar1->outputType + lVar6),type_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
    poVar3 = std::operator<<(poVar3,"_");
    Array::usageTypeToString_abi_cxx11_
              (&local_1d8,(Array *)(ulong)*(uint *)((long)&pAVar1->usage + lVar6),usage);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    std::operator<<(poVar3,"_");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x40;
    storage = extraout_EDX_01;
  }
  if (this->first != 0) {
    poVar3 = std::operator<<(local_1a8,"first");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    std::operator<<(poVar3,"_");
  }
  if (this->primitive == PRIMITIVE_TRIANGLES) {
    pcVar4 = "quads_";
  }
  else {
    if (this->primitive != PRIMITIVE_POINTS) goto LAB_0045ff27;
    pcVar4 = "points_";
  }
  std::operator<<(local_1a8,pcVar4);
LAB_0045ff27:
  std::ostream::operator<<(local_1a8,this->drawCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getName (void) const
{
	std::stringstream name;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		if (arrays.size() > 1)
			name << "array" << ndx << "_";

		name
			<< Array::storageToString(array.storage) << "_"
			<< array.offset << "_"
			<< array.stride << "_"
			<< Array::inputTypeToString((Array::InputType)array.inputType);
		if (array.inputType != Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && array.inputType != Array::INPUTTYPE_INT_2_10_10_10)
			name << array.componentCount;
		name
			<< "_"
			<< (array.normalize ? "normalized_" : "")
			<< Array::outputTypeToString(array.outputType) << "_"
			<< Array::usageTypeToString(array.usage) << "_";
	}

	if (first)
		name << "first" << first << "_";

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			name << "quads_";
			break;
		case Array::PRIMITIVE_POINTS:
			name << "points_";
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	name << drawCount;

	return name.str();
}